

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

int VP8GetCostLuma4(VP8EncIterator *it,int16_t *levels)

{
  int iVar1;
  int iVar2;
  int16_t *in_RSI;
  long in_RDI;
  int ctx;
  int R;
  VP8Encoder *enc;
  VP8Residual res;
  int y;
  int x;
  VP8Residual local_48;
  int local_18;
  uint local_14;
  int16_t *local_10;
  long local_8;
  
  local_14 = *(uint *)(in_RDI + 0x80) & 3;
  local_18 = *(int *)(in_RDI + 0x80) >> 2;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VP8InitResidual(0,3,*(VP8Encoder **)(in_RDI + 0x28),&local_48);
  iVar2 = *(int *)(local_8 + 0x84 + (long)(int)local_14 * 4);
  iVar1 = *(int *)(local_8 + 0xa8 + (long)local_18 * 4);
  (*VP8SetResidualCoeffs)(local_10,&local_48);
  iVar2 = (*VP8GetResidualCost)(iVar2 + iVar1,&local_48);
  return iVar2;
}

Assistant:

int VP8GetCostLuma4(VP8EncIterator* const it, const int16_t levels[16]) {
  const int x = (it->i4_ & 3), y = (it->i4_ >> 2);
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int R = 0;
  int ctx;

  VP8InitResidual(0, 3, enc, &res);
  ctx = it->top_nz_[x] + it->left_nz_[y];
  VP8SetResidualCoeffs(levels, &res);
  R += VP8GetResidualCost(ctx, &res);
  return R;
}